

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_shaders.cxx
# Opt level: O1

void __thiscall
xray_re::xr_level_shaders::load(xr_level_shaders *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *s;
  xr_reader *local_20;
  
  local_20 = (xr_reader *)0x0;
  if (xrlc_version == 5) {
    local_20 = xr_reader::open_chunk(r,3);
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x5a,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_shaders_v5(this,local_20);
    xr_reader::close_chunk(r,&local_20);
    local_20 = xr_reader::open_chunk(r,2);
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x5e,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_textures_v5(this,local_20);
  }
  else if ((xrlc_version & 0xfffffffc) == 8) {
    local_20 = xr_reader::open_chunk(r,2);
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x62,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_v8(this,local_20);
  }
  else if (0xb < xrlc_version) {
    local_20 = xr_reader::open_chunk(r,2);
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x66,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_v13(this,local_20);
  }
  xr_reader::close_chunk(r,&local_20);
  return;
}

Assistant:

void xr_level_shaders::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5) {
		s = r.open_chunk(FSL5_SHADERS);
		xr_assert(s);
		load_shaders_v5(*s);
		r.close_chunk(s);
		s = r.open_chunk(FSL5_TEXTURES);
		xr_assert(s);
		load_textures_v5(*s);
	} else if (xrlc_version >= XRLC_VERSION_8 && xrlc_version <= XRLC_VERSION_11) {
		s = r.open_chunk(FSL8_SHADERS);
		xr_assert(s);
		load_v8(*s);
	} else if (xrlc_version >= XRLC_VERSION_12) {
		s = r.open_chunk(FSL13_SHADERS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}